

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O3

void __thiscall n_pca::NPca::setTestMatrix(NPca *this,string *test_config_path)

{
  iterator __position;
  long lVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  istream *piVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_data_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_data;
  string input_str;
  Mat image;
  Exception e;
  ifstream file;
  allocator local_3b9 [13];
  uint local_3ac;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_3a8;
  vector<int,_std::allocator<int>_> *local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  int local_370;
  undefined4 uStack_36c;
  undefined1 local_360 [16];
  string local_350;
  Mat local_330 [8];
  int local_328;
  int local_324;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_2d0 [6];
  long local_238 [65];
  
  if (test_config_path->_M_string_length == 0) {
    puts("couldn\'t find test_config_path");
    return;
  }
  std::ifstream::ifstream(local_238,(test_config_path->_M_dataplus)._M_p,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    printf("couldn\'t open test_config_path: %s\n",(test_config_path->_M_dataplus)._M_p);
  }
  else {
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    local_350._M_string_length = 0;
    local_350.field_2._M_local_buf[0] = '\0';
    local_3ac = this->n_config_->image_width_ * this->n_config_->image_height_;
    local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_390 = &this->test_label_;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_350,cVar4);
      uVar3 = local_3ac;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      NConfig::n_split(&local_388,this->n_config_,&local_350,' ');
      if (0x20 < (ulong)((long)local_388.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_388.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        cv::Mat::Mat(local_330);
        std::__cxx11::string::string
                  ((string *)&local_370,
                   ((local_388.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,local_3b9);
        cv::imread((string *)local_2d0,(int)(string *)&local_370);
        cv::Mat::operator=(local_330,(Mat *)local_2d0);
        cv::Mat::~Mat((Mat *)local_2d0);
        if ((undefined1 *)CONCAT44(uStack_36c,local_370) != local_360) {
          operator_delete((undefined1 *)CONCAT44(uStack_36c,local_370));
        }
        cVar4 = cv::Mat::empty();
        if (cVar4 == '\0') {
          if ((local_324 != this->n_config_->image_width_) ||
             (local_328 != this->n_config_->image_height_)) {
            n_resize(this,local_330);
          }
          cv::Mat::reshape((int)local_2d0,(int)local_330);
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                    (&local_3a8,(value_type *)local_2d0);
          local_370 = atoi(local_388.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
          __position._M_current =
               (this->test_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->test_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_390,__position,&local_370);
          }
          else {
            *__position._M_current = local_370;
            (this->test_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          cv::Mat::~Mat((Mat *)local_2d0);
        }
        cv::Mat::~Mat(local_330);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
    }
    local_2d0[0].m_rows.m_value =
         ((long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    local_2d0[0].m_cols.m_value = (long)(int)local_3ac;
    local_2d0[0].m_functor.m_other = 0.0;
    if ((local_2d0[0].m_rows.m_value | local_2d0[0].m_cols.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->test_matrix_,local_2d0,(assign_op<double,_double> *)local_330);
    if ((long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar6 = ((long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      pdVar7 = (this->test_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_storage.m_data;
      lVar1 = (this->test_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      lVar8 = 0;
      do {
        if (0 < (int)uVar3) {
          lVar2 = *(long *)(local_3a8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar8 * 0x60 + 0x10);
          uVar10 = 0;
          pdVar9 = pdVar7;
          do {
            *pdVar9 = (double)*(byte *)(lVar2 + uVar10);
            uVar10 = uVar10 + 1;
            pdVar9 = pdVar9 + lVar1;
          } while (uVar3 != uVar10);
        }
        lVar8 = lVar8 + 1;
        pdVar7 = pdVar7 + 1;
      } while (lVar8 != lVar6 + (ulong)(lVar6 == 0));
    }
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void NPca::setTestMatrix(const string test_config_path)
{
    if (test_config_path.length() <= 0)
    {
        printf("couldn't find test_config_path\n");
        return;
    }

    ifstream file(test_config_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open test_config_path: %s\n", test_config_path.c_str());
        return;
    }

    string input_str;
    int count = 0;
    int size = n_config_->image_height_ * n_config_->image_width_;
    vector<Mat> image_data_;

    while (getline(file, input_str))
    {
        vector<string> read_data = n_config_->n_split(input_str, ' ');

        if (read_data.size() < 2)
            continue;
        
        Mat image;
        try{
            image = imread(read_data[0].c_str(), IMREAD_GRAYSCALE);
            
            if (image.empty())
                continue;

        } catch (Exception e) {
            continue;
        }

        // n_resize
        if (image.cols != n_config_->image_width_ || image.rows != n_config_->image_height_)
        {
            n_resize(image);
        }

        Mat reshap_image = image.reshape(0, 1);
        image_data_.push_back(reshap_image);
        test_label_.push_back(atoi(read_data[1].c_str()));
    }
    
    // set test_matrix
    test_matrix_ = MatrixXd::Zero(image_data_.size(), size);

    for (int i = 0; i < image_data_.size(); i++)
    {
        for (int j = 0; j < size; j++)
        {
            test_matrix_.coeffRef(i, j) = image_data_[i].data[j];
        }
    }
}